

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  undefined8 *puVar1;
  stbi_uc *psVar2;
  bool bVar3;
  stbi_uc sVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  stbi_uc *psVar14;
  stbi_uc *__s;
  stbi_uc *__s_00;
  char *pcVar15;
  byte *pbVar16;
  byte bVar17;
  int iVar18;
  undefined4 in_register_0000000c;
  ulong uVar19;
  uint uVar20;
  uint n;
  uint uVar21;
  uint uVar22;
  stbi__context *unaff_R15;
  long *in_FS_OFFSET;
  bool bVar23;
  uint local_8c;
  stbi__context *local_88;
  uint local_74;
  
  psVar2 = g->out;
  if (psVar2 == (stbi_uc *)0x0) {
    iVar8 = stbi__gif_header(s,g,comp,0);
    if (iVar8 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar8 = g->w;
    iVar9 = g->h;
    iVar10 = stbi__mad3sizes_valid(4,iVar8,iVar9,0);
    if (iVar10 == 0) {
      pcVar15 = "too large";
    }
    else {
      iVar9 = iVar9 * iVar8;
      unaff_R15 = (stbi__context *)(long)(iVar9 * 4);
      psVar14 = (stbi_uc *)malloc((size_t)unaff_R15);
      g->out = psVar14;
      __s = (stbi_uc *)malloc((size_t)unaff_R15);
      g->background = __s;
      local_88 = (stbi__context *)(long)iVar9;
      __s_00 = (stbi_uc *)malloc((size_t)local_88);
      g->history = __s_00;
      pcVar15 = "outofmem";
      if ((psVar14 != (stbi_uc *)0x0) && (__s_00 != (stbi_uc *)0x0 && __s != (stbi_uc *)0x0)) {
        memset(psVar14,0,(size_t)unaff_R15);
        memset(__s,0,(size_t)unaff_R15);
        memset(__s_00,0,(size_t)local_88);
        goto LAB_0013f421;
      }
    }
    *(char **)(*in_FS_OFFSET + -0x20) = pcVar15;
    unaff_R15 = (stbi__context *)0x0;
  }
  else {
    uVar21 = (uint)g->eflags >> 2 & 7;
    uVar7 = g->h * g->w;
    uVar13 = 2;
    if (uVar21 != 3) {
      uVar13 = uVar21;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar13 = uVar21;
    }
    if (uVar13 == 3) {
      if (0 < (int)uVar7) {
        uVar19 = 0;
        do {
          if (g->history[uVar19] != '\0') {
            *(undefined4 *)(g->out + uVar19 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar19 * 4);
          }
          uVar19 = uVar19 + 1;
        } while (uVar7 != uVar19);
      }
    }
    else if ((uVar13 == 2) && (0 < (int)uVar7)) {
      uVar19 = 0;
      do {
        if (g->history[uVar19] != '\0') {
          *(undefined4 *)(g->out + uVar19 * 4) = *(undefined4 *)(g->background + uVar19 * 4);
        }
        uVar19 = uVar19 + 1;
      } while (uVar7 != uVar19);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
LAB_0013f421:
    memset(g->history,0,(long)g->h * (long)g->w);
    puVar1 = (undefined8 *)(*in_FS_OFFSET + -0x20);
    do {
      psVar14 = s->img_buffer;
      if (psVar14 < s->img_buffer_end) {
LAB_0013f493:
        s->img_buffer = psVar14 + 1;
        sVar4 = *psVar14;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar14 = s->img_buffer;
          goto LAB_0013f493;
        }
        sVar4 = '\0';
      }
      if (sVar4 == '!') {
        psVar14 = s->img_buffer;
        if (s->img_buffer_end <= psVar14) {
          if (s->read_from_callbacks == 0) goto LAB_0013fbc2;
          stbi__refill_buffer(s);
          psVar14 = s->img_buffer;
        }
        s->img_buffer = psVar14 + 1;
        if (*psVar14 != 0xf9) goto LAB_0013fbc2;
        pbVar16 = s->img_buffer;
        if (pbVar16 < s->img_buffer_end) {
LAB_0013f570:
          s->img_buffer = pbVar16 + 1;
          bVar6 = *pbVar16;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar16 = s->img_buffer;
            goto LAB_0013f570;
          }
          bVar6 = 0;
        }
        if (bVar6 == 4) {
          pbVar16 = s->img_buffer;
          if (pbVar16 < s->img_buffer_end) {
LAB_0013f5af:
            s->img_buffer = pbVar16 + 1;
            uVar13 = (uint)*pbVar16;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar16 = s->img_buffer;
              goto LAB_0013f5af;
            }
            uVar13 = 0;
          }
          g->eflags = uVar13;
          iVar8 = stbi__get16le(s);
          g->delay = iVar8 * 10;
          if (-1 < (long)g->transparent) {
            g->pal[g->transparent][3] = 0xff;
          }
          if ((g->eflags & 1) != 0) {
            pbVar16 = s->img_buffer;
            if (pbVar16 < s->img_buffer_end) {
LAB_0013f744:
              s->img_buffer = pbVar16 + 1;
              bVar6 = *pbVar16;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar16 = s->img_buffer;
                goto LAB_0013f744;
              }
              bVar6 = 0;
            }
            g->transparent = (uint)bVar6;
            g->pal[bVar6][3] = '\0';
            goto LAB_0013fbc2;
          }
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013f60c:
            s->img_buffer = s->img_buffer + 1;
          }
          else {
            iVar8 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
            if (0 < iVar8) goto LAB_0013f60c;
            s->img_buffer = s->img_buffer_end;
            (*(s->io).skip)(s->io_user_data,1 - iVar8);
          }
          g->transparent = -1;
LAB_0013fbc2:
          do {
            pbVar16 = s->img_buffer;
            if (pbVar16 < s->img_buffer_end) {
LAB_0013fbe8:
              s->img_buffer = pbVar16 + 1;
              bVar6 = *pbVar16;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar16 = s->img_buffer;
                goto LAB_0013fbe8;
              }
              bVar6 = 0;
            }
            if (bVar6 == 0) goto LAB_0013f6de;
            stbi__skip(s,(uint)bVar6);
          } while( true );
        }
        stbi__skip(s,(uint)bVar6);
LAB_0013f6de:
        bVar23 = true;
      }
      else if (sVar4 == ';') {
        bVar23 = false;
        unaff_R15 = s;
      }
      else {
        if (sVar4 == ',') {
          iVar8 = stbi__get16le(s);
          iVar9 = stbi__get16le(s);
          iVar10 = stbi__get16le(s);
          iVar11 = stbi__get16le(s);
          if ((iVar10 + iVar8 <= g->w) && (iVar11 + iVar9 <= g->h)) {
            iVar18 = g->w * 4;
            g->line_size = iVar18;
            g->start_x = iVar8 << 2;
            g->start_y = iVar9 * iVar18;
            g->max_x = (iVar10 + iVar8) * 4;
            iVar11 = iVar18 * (iVar11 + iVar9);
            g->max_y = iVar11;
            g->cur_x = iVar8 << 2;
            if (iVar10 != 0) {
              iVar11 = iVar9 * iVar18;
            }
            g->cur_y = iVar11;
            pbVar16 = s->img_buffer;
            if (pbVar16 < s->img_buffer_end) {
LAB_0013f6a0:
              s->img_buffer = pbVar16 + 1;
              uVar13 = (uint)*pbVar16;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar16 = s->img_buffer;
                goto LAB_0013f6a0;
              }
              uVar13 = 0;
            }
            g->lflags = uVar13;
            if ((uVar13 & 0x40) == 0) {
              g->step = g->line_size;
              g->parse = 0;
            }
            else {
              g->step = g->line_size << 3;
              g->parse = 3;
            }
            if ((char)(byte)uVar13 < '\0') {
              iVar8 = -1;
              if ((g->eflags & 1) != 0) {
                iVar8 = g->transparent;
              }
              stbi__gif_parse_colortable(s,g->lpal,2 << ((byte)uVar13 & 7),iVar8);
              g->color_table = g->lpal[0];
            }
            else {
              if ((g->flags & 0x80) == 0) {
                pcVar15 = "missing color table";
                goto LAB_0013f61f;
              }
              g->color_table = g->pal[0];
            }
            pbVar16 = s->img_buffer;
            if (pbVar16 < s->img_buffer_end) {
LAB_0013f7c8:
              s->img_buffer = pbVar16 + 1;
              bVar6 = *pbVar16;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar16 = s->img_buffer;
                goto LAB_0013f7c8;
              }
              bVar6 = 0;
            }
            if (bVar6 < 0xd) {
              uVar13 = 1 << (bVar6 & 0x1f);
              uVar19 = 0;
              do {
                g->codes[uVar19].prefix = -1;
                g->codes[uVar19].first = (stbi_uc)uVar19;
                g->codes[uVar19].suffix = (stbi_uc)uVar19;
                uVar19 = uVar19 + 1;
              } while (uVar13 != uVar19);
              uVar12 = (2 << (bVar6 & 0x1f)) - 1;
              local_8c = 0xffffffff;
              bVar23 = true;
              n = 0;
              iVar9 = 0;
              uVar21 = 0;
              uVar7 = uVar13 + 2;
              local_74 = uVar12;
              iVar8 = bVar6 + 1;
LAB_0013f861:
              do {
                iVar10 = iVar9 - iVar8;
                if (iVar8 <= iVar9) {
                  bVar17 = (byte)iVar8;
                  uVar22 = uVar21 & local_74;
                  bVar3 = true;
                  if (uVar22 == uVar13) {
                    iVar8 = bVar6 + 1;
                    uVar22 = 0xffffffff;
                    local_74 = uVar12;
                    local_8c = uVar13 + 2;
                    bVar23 = false;
                  }
                  else {
                    if (uVar22 == uVar13 + 1) {
                      do {
                        stbi__skip(s,n);
                        pbVar16 = s->img_buffer;
                        if (pbVar16 < s->img_buffer_end) {
LAB_0013f971:
                          s->img_buffer = pbVar16 + 1;
                          bVar5 = *pbVar16;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar16 = s->img_buffer;
                            goto LAB_0013f971;
                          }
                          bVar5 = 0;
                        }
                        if (bVar5 == 0) goto LAB_0013f9ae;
                        n = (uint)bVar5;
                      } while( true );
                    }
                    if ((int)uVar7 < (int)uVar22) {
                      *puVar1 = "illegal code in raster";
                    }
                    else if (bVar23) {
                      *puVar1 = "no clear code";
                      bVar23 = true;
                    }
                    else {
                      if ((int)local_8c < 0) {
                        if (uVar22 != uVar7) goto LAB_0013faa0;
                        *puVar1 = "illegal code in raster";
                      }
                      else {
                        uVar20 = uVar7 + 1;
                        if ((int)uVar7 < 0x2000) {
                          g->codes[(int)uVar7].prefix = (stbi__int16)local_8c;
                          sVar4 = g->codes[local_8c].first;
                          g->codes[(int)uVar7].first = sVar4;
                          if (uVar22 != uVar20) {
                            sVar4 = g->codes[(int)uVar22].first;
                          }
                          g->codes[(int)uVar7].suffix = sVar4;
                          uVar7 = uVar20;
LAB_0013faa0:
                          local_8c = uVar7;
                          stbi__out_gif_code(g,(stbi__uint16)uVar22);
                          bVar23 = (local_8c & local_74) == 0;
                          iVar9 = iVar8 + 1;
                          if ((int)local_8c < 0x1000 && bVar23) {
                            iVar8 = iVar9;
                          }
                          if ((int)local_8c < 0x1000 && bVar23) {
                            local_74 = ~(-1 << ((byte)iVar9 & 0x1f));
                          }
                          bVar23 = false;
                          bVar3 = true;
                          goto LAB_0013f9f8;
                        }
                        *puVar1 = "too many codes";
                        uVar7 = uVar20;
                      }
                      bVar23 = false;
                    }
                    bVar3 = false;
                    local_88 = (stbi__context *)0x0;
                    uVar22 = local_8c;
                    local_8c = uVar7;
                  }
                  goto LAB_0013f9f8;
                }
                if (n == 0) {
                  pbVar16 = s->img_buffer;
                  if (pbVar16 < s->img_buffer_end) {
LAB_0013f894:
                    s->img_buffer = pbVar16 + 1;
                    bVar17 = *pbVar16;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar16 = s->img_buffer;
                      goto LAB_0013f894;
                    }
                    bVar17 = 0;
                  }
                  if (bVar17 == 0) {
                    local_88 = (stbi__context *)g->out;
                    goto LAB_0013fafb;
                  }
                  n = (uint)bVar17;
                }
                pbVar16 = s->img_buffer;
                if (pbVar16 < s->img_buffer_end) {
LAB_0013f8d2:
                  s->img_buffer = pbVar16 + 1;
                  uVar22 = (uint)*pbVar16;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar16 = s->img_buffer;
                    goto LAB_0013f8d2;
                  }
                  uVar22 = 0;
                }
                bVar17 = (byte)iVar9;
                n = n - 1;
                iVar9 = iVar9 + 8;
                uVar21 = uVar21 | uVar22 << (bVar17 & 0x1f);
              } while( true );
            }
            local_88 = (stbi__context *)0x0;
LAB_0013fafb:
            if (local_88 == (stbi__context *)0x0) {
              bVar23 = false;
              unaff_R15 = (stbi__context *)0x0;
            }
            else {
              unaff_R15 = local_88;
              if (psVar2 == (stbi_uc *)0x0) {
                uVar13 = g->h * g->w;
                if ((int)uVar13 < 1 || g->bgindex < 1) {
                  bVar23 = false;
                }
                else {
                  uVar19 = 0;
                  do {
                    if (g->history[uVar19] == '\0') {
                      g->pal[g->bgindex][3] = 0xff;
                      *(stbi_uc (*) [4])(g->out + uVar19 * 4) = g->pal[g->bgindex];
                    }
                    uVar19 = uVar19 + 1;
                    bVar23 = false;
                  } while (uVar13 != uVar19);
                }
              }
              else {
                bVar23 = false;
              }
            }
            goto LAB_0013f6e0;
          }
          pcVar15 = "bad Image Descriptor";
        }
        else {
          pcVar15 = "unknown code";
        }
LAB_0013f61f:
        *puVar1 = pcVar15;
        bVar23 = false;
        unaff_R15 = (stbi__context *)0x0;
      }
LAB_0013f6e0:
    } while (bVar23);
  }
  return (stbi_uc *)unaff_R15;
LAB_0013f9ae:
  local_88 = (stbi__context *)g->out;
  n = 0;
  bVar3 = false;
  uVar22 = local_8c;
  local_8c = uVar7;
LAB_0013f9f8:
  iVar9 = iVar10;
  uVar21 = (int)uVar21 >> (bVar17 & 0x1f);
  uVar7 = local_8c;
  local_8c = uVar22;
  if (!bVar3) goto LAB_0013fafb;
  goto LAB_0013f861;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispose of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}